

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

uint32_t cpu_lduw_data_ra_mips64(CPUArchState_conflict10 *env,target_ulong ptr,uintptr_t retaddr)

{
  int mmu_idx;
  uint32_t uVar1;
  uintptr_t retaddr_local;
  target_ulong ptr_local;
  CPUArchState_conflict10 *env_local;
  
  mmu_idx = cpu_mmu_index(env,false);
  uVar1 = cpu_lduw_mmuidx_ra_mips64(env,ptr,mmu_idx,retaddr);
  return uVar1;
}

Assistant:

uint32_t cpu_lduw_data_ra(CPUArchState *env, target_ulong ptr,
                          uintptr_t retaddr)
{
    return cpu_lduw_mmuidx_ra(env, ptr, cpu_mmu_index(env, false), retaddr);
}